

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
write_decimal<unsigned_int>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           *this,uint value)

{
  basic_buffer<wchar_t> *pbVar1;
  size_t sVar2;
  wchar_t *pwVar3;
  bool bVar4;
  char *pcVar5;
  ulong uVar6;
  byte bVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  char acStack_35 [13];
  
  uVar9 = 0x1f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  uVar9 = (uVar9 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar10 = (ulong)((uVar9 - (value < *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 +
                                              (ulong)uVar9 * 4))) + 1);
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->size_;
  uVar6 = uVar10 + sVar2;
  if (pbVar1->capacity_ < uVar6) {
    (**pbVar1->_vptr_basic_buffer)(pbVar1,uVar6);
  }
  pbVar1->size_ = uVar6;
  pcVar5 = acStack_35 + uVar10;
  uVar9 = value;
  if (99 < value) {
    do {
      value = uVar9 / 100;
      *(undefined2 *)(pcVar5 + -2) =
           *(undefined2 *)(internal::basic_data<void>::DIGITS + (ulong)(uVar9 % 100) * 2);
      pcVar5 = pcVar5 + -2;
      bVar4 = 9999 < uVar9;
      uVar9 = uVar9 / 100;
    } while (bVar4);
  }
  pwVar3 = pbVar1->ptr_;
  if (value < 10) {
    bVar7 = (byte)value | 0x30;
    lVar8 = -1;
  }
  else {
    pcVar5[-1] = internal::basic_data<void>::DIGITS[((ulong)value * 2 & 0xffffffff) + 1];
    bVar7 = internal::basic_data<void>::DIGITS[(ulong)value * 2];
    lVar8 = -2;
  }
  pcVar5[lVar8] = bVar7;
  if (uVar10 != 0) {
    uVar6 = 0;
    do {
      pwVar3[sVar2 + uVar6] = (int)acStack_35[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar10 != uVar6);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }